

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O0

void __thiscall dlib::button::~button(button *this)

{
  void *in_RDI;
  
  ~button(this);
  operator_delete(in_RDI);
  return;
}

Assistant:

~button() { disable_events(); parent.invalidate_rectangle(style->get_invalidation_rect(rect)); }